

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall
cmGraphVizWriter::WriteNode
          (cmGraphVizWriter *this,string *targetName,cmTarget *target,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,cmGeneratedFileStream *str)

{
  iterator iVar1;
  const_iterator cVar2;
  ostream *poVar3;
  size_t sVar4;
  char *__s;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&insertedNodes->_M_t,targetName);
  if ((_Rb_tree_header *)iVar1._M_node != &(insertedNodes->_M_t)._M_impl.super__Rb_tree_header) {
    return;
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)insertedNodes,targetName);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->TargetNamesNodes)._M_t,targetName);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)str,"    \"",5);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)str,*(char **)(cVar2._M_node + 2),(long)cVar2._M_node[2]._M_parent)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" [ label=\"",0xb);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(targetName->_M_dataplus)._M_p,targetName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" shape=\"",9);
  if (target == (cmTarget *)0x0) {
    __s = "ellipse";
  }
  else if ((ulong)target->TargetTypeValue < 4) {
    __s = &DAT_004cb024 + *(int *)(&DAT_004cb024 + (ulong)target->TargetTypeValue * 4);
  }
  else {
    __s = "box";
  }
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"];",3);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void cmGraphVizWriter::WriteNode(const std::string& targetName,
                                 const cmTarget* target,
                                 std::set<std::string>& insertedNodes,
                                 cmGeneratedFileStream& str) const
{
  if (insertedNodes.find(targetName) == insertedNodes.end())
  {
    insertedNodes.insert(targetName);
    std::map<std::string, std::string>::const_iterator nameIt =
                                       this->TargetNamesNodes.find(targetName);

    str << "    \"" << nameIt->second << "\" [ label=\""
        << targetName <<  "\" shape=\"" << getShapeForTarget(target)
        << "\"];" << std::endl;
  }
}